

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O3

void __thiscall
duckdb::DbpEncoder::BeginWriteInternal(DbpEncoder *this,WriteStream *writer,int64_t *first_value)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  undefined8 uStack_38;
  
  uVar2 = 0x800;
  uStack_38 = in_RAX;
  do {
    uStack_38._0_5_ = CONCAT14((0x7f < uVar2) << 7 | (byte)uVar2,(undefined4)uStack_38);
    (**writer->_vptr_WriteStream)(writer,(long)&uStack_38 + 4,1);
    bVar1 = 0x7f < uVar2;
    uVar2 = uVar2 >> 7;
  } while (bVar1);
  uStack_38 = CONCAT17(8,(undefined7)uStack_38);
  (**writer->_vptr_WriteStream)(writer,(long)&uStack_38 + 7,1);
  uVar2 = this->total_value_count;
  do {
    uStack_38._0_6_ = CONCAT15((0x7f < uVar2) << 7 | (byte)uVar2 & 0x7f,(undefined5)uStack_38);
    (**writer->_vptr_WriteStream)(writer,(long)&uStack_38 + 5,1);
    bVar1 = 0x7f < uVar2;
    uVar2 = uVar2 >> 7;
  } while (bVar1);
  uVar2 = *first_value >> 0x3f ^ *first_value * 2;
  do {
    uStack_38._0_7_ = CONCAT16((0x7f < uVar2) << 7 | (byte)uVar2 & 0x7f,(undefined6)uStack_38);
    (**writer->_vptr_WriteStream)(writer,(long)&uStack_38 + 6,1);
    bVar1 = 0x7f < uVar2;
    uVar2 = uVar2 >> 7;
  } while (bVar1);
  if (this->total_value_count != 0) {
    this->count = this->count + 1;
  }
  this->previous_value = *first_value;
  this->min_delta = 0x7fffffffffffffff;
  this->block_count = 0;
  return;
}

Assistant:

void BeginWriteInternal(WriteStream &writer, const int64_t &first_value) {
		// <block size in values> <number of miniblocks in a block> <total value count> <first value>

		// the block size is a multiple of 128; it is stored as a ULEB128 int
		ParquetDecodeUtils::VarintEncode(BLOCK_SIZE_IN_VALUES, writer);
		// the miniblock count per block is a divisor of the block size such that their quotient,
		// the number of values in a miniblock, is a multiple of 32
		static_assert(BLOCK_SIZE_IN_VALUES % NUMBER_OF_MINIBLOCKS_IN_A_BLOCK == 0 &&
		                  NUMBER_OF_VALUES_IN_A_MINIBLOCK % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0,
		              "invalid block sizes for DELTA_BINARY_PACKED");
		// it is stored as a ULEB128 int
		ParquetDecodeUtils::VarintEncode(NUMBER_OF_MINIBLOCKS_IN_A_BLOCK, writer);
		// the total value count is stored as a ULEB128 int
		ParquetDecodeUtils::VarintEncode(total_value_count, writer);
		// the first value is stored as a zigzag ULEB128 int
		ParquetDecodeUtils::VarintEncode(ParquetDecodeUtils::IntToZigzag(first_value), writer);

		// initialize
		if (total_value_count != 0) {
			count++;
		}
		previous_value = first_value;

		min_delta = NumericLimits<int64_t>::Maximum();
		block_count = 0;
	}